

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_seti(lua_State *L,int idx,lua_Integer n)

{
  StkId pTVar1;
  uint uVar2;
  int iVar3;
  TValue *local_d0;
  lua_Integer *data_4;
  GCObject *pGStack_b0;
  uint ukey_4;
  lua_Integer i;
  lua_Integer *data_3;
  TValue *pTStack_98;
  uint ukey_3;
  TValue *val_1;
  lua_Number *data_2;
  lua_Number lStack_80;
  uint ukey_2;
  lua_Number d;
  lua_Number *data_1;
  char *pcStack_68;
  uint ukey_1;
  lua_Number *data;
  TValue *pTStack_58;
  uint ukey;
  TValue *val;
  RaviArray *h;
  TValue *io;
  TValue *io2;
  TValue *io1;
  TValue *slot;
  StkId t;
  lua_Integer n_local;
  lua_State *plStack_10;
  int idx_local;
  lua_State *L_local;
  
  iVar3 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar3 + 1;
  t = (StkId)n;
  n_local._4_4_ = idx;
  plStack_10 = L;
  if (iVar3 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x3fb,"void lua_seti(lua_State *, int, lua_Integer)");
  }
  if ((long)L->top - (long)L->ci->func >> 4 < 2) {
    __assert_fail("((1) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x3fc,"void lua_seti(lua_State *, int, lua_Integer)");
  }
  slot = index2addr(L,idx);
  if ((slot->tt_ == 0x8005) || ((slot->tt_ & 0xf) != 5)) {
    if ((slot->tt_ & 0xf) == 5) {
      if (slot->tt_ != 0x8005) {
        __assert_fail("((((t))->tt_) == (((5) | (1 << 15))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x3ff,"void lua_seti(lua_State *, int, lua_Integer)");
      }
      if (((slot->value_).gc)->tt != '\x05') {
        __assert_fail("(((t)->value_).gc)->tt == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x3ff,"void lua_seti(lua_State *, int, lua_Integer)");
      }
      if (&t[-1].field_0xf < (undefined1 *)(ulong)*(uint *)((slot->value_).f + 0xc)) {
        if (slot->tt_ != 0x8005) {
          __assert_fail("((((t))->tt_) == (((5) | (1 << 15))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x3ff,"void lua_seti(lua_State *, int, lua_Integer)");
        }
        if (((slot->value_).gc)->tt != '\x05') {
          __assert_fail("(((t)->value_).gc)->tt == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x3ff,"void lua_seti(lua_State *, int, lua_Integer)");
        }
        local_d0 = (TValue *)(*(long *)((slot->value_).f + 0x10) + (long)&t[-1].field_0xf * 0x10);
      }
      else {
        if (slot->tt_ != 0x8005) {
          __assert_fail("((((t))->tt_) == (((5) | (1 << 15))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x3ff,"void lua_seti(lua_State *, int, lua_Integer)");
        }
        if (((slot->value_).gc)->tt != '\x05') {
          __assert_fail("(((t)->value_).gc)->tt == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x3ff,"void lua_seti(lua_State *, int, lua_Integer)");
        }
        local_d0 = luaH_getint((Table *)(slot->value_).gc,(lua_Integer)t);
      }
      io1 = local_d0;
      if (local_d0->tt_ != 0) {
        io2 = local_d0;
        pTVar1 = plStack_10->top;
        io = pTVar1 + -1;
        local_d0->value_ = io->value_;
        local_d0->tt_ = pTVar1[-1].tt_;
        if ((local_d0->tt_ & 0x8000) != 0) {
          if ((local_d0->tt_ & 0x8000) == 0) {
            __assert_fail("(((io1)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x400,"void lua_seti(lua_State *, int, lua_Integer)");
          }
          if ((local_d0->tt_ & 0x7f) != (ushort)((local_d0->value_).gc)->tt) {
LAB_0011a960:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x400,"void lua_seti(lua_State *, int, lua_Integer)");
          }
          if (plStack_10 != (lua_State *)0x0) {
            if ((local_d0->tt_ & 0x8000) == 0) {
              __assert_fail("(((io1)->tt_) & (1 << 15))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                            ,0x400,"void lua_seti(lua_State *, int, lua_Integer)");
            }
            if ((((local_d0->value_).gc)->marked & (plStack_10->l_G->currentwhite ^ 0x18)) != 0)
            goto LAB_0011a960;
          }
        }
        if ((plStack_10->top[-1].tt_ & 0x8000) != 0) {
          if ((slot->tt_ & 0x8000) == 0) {
            __assert_fail("(((t)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x400,"void lua_seti(lua_State *, int, lua_Integer)");
          }
          if ((((slot->value_).gc)->marked & 0x20) != 0) {
            if ((plStack_10->top[-1].tt_ & 0x8000) == 0) {
              __assert_fail("(((L->top - 1)->tt_) & (1 << 15))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                            ,0x400,"void lua_seti(lua_State *, int, lua_Integer)");
            }
            if (((plStack_10->top[-1].value_.gc)->marked & 0x18) != 0) {
              if ((slot->tt_ & 0x8000) == 0) {
                __assert_fail("(((t)->tt_) & (1 << 15))",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                              ,0x400,"void lua_seti(lua_State *, int, lua_Integer)");
              }
              luaC_barrierback_(plStack_10,(slot->value_).gc);
            }
          }
        }
        plStack_10->top = plStack_10->top + -1;
        goto LAB_0011b016;
      }
    }
    else {
      io1 = (TValue *)0x0;
    }
    h = (RaviArray *)plStack_10->top;
    h->next = (GCObject *)t;
    h->tt = '\x13';
    h->marked = '\0';
    plStack_10->top = plStack_10->top + 1;
    if (plStack_10->ci->top < plStack_10->top) {
      __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x405,"void lua_seti(lua_State *, int, lua_Integer)");
    }
    luaV_finishset(plStack_10,slot,plStack_10->top + -1,plStack_10->top + -2,io1);
    plStack_10->top = plStack_10->top + -2;
  }
  else {
    if ((slot->tt_ != 0x8015) && (slot->tt_ != 0x8025)) {
      __assert_fail("(((((t))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x40b,"void lua_seti(lua_State *, int, lua_Integer)");
    }
    if ((((slot->value_).gc)->tt != '\x15') && (((slot->value_).gc)->tt != '%')) {
      __assert_fail("((((t)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x40b,"void lua_seti(lua_State *, int, lua_Integer)");
    }
    val = (TValue *)(slot->value_).gc;
    uVar2 = (uint)t;
    if (slot->tt_ == 0x8025) {
      pTVar1 = plStack_10->top;
      pTStack_58 = pTVar1 + -1;
      if (pTVar1[-1].tt_ == 3) {
        pcStack_68 = ((RaviArray *)val)->data;
        data._4_4_ = uVar2;
        if (uVar2 < ((RaviArray *)val)->len) {
          if (pTVar1[-1].tt_ != 3) {
            __assert_fail("((((val))->tt_) == (((3) | ((0) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x40e,"void lua_seti(lua_State *, int, lua_Integer)");
          }
          *(Value *)(pcStack_68 + ((ulong)t & 0xffffffff) * 8) = pTStack_58->value_;
        }
        else {
          if (pTVar1[-1].tt_ != 3) {
            __assert_fail("((((val))->tt_) == (((3) | ((0) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x40e,"void lua_seti(lua_State *, int, lua_Integer)");
          }
          raviH_set_float(plStack_10,(RaviArray *)val,(ulong)t & 0xffffffff,(pTStack_58->value_).n);
        }
      }
      else if (pTVar1[-1].tt_ == 0x13) {
        d = (lua_Number)((RaviArray *)val)->data;
        data_1._4_4_ = uVar2;
        if (uVar2 < ((RaviArray *)val)->len) {
          if (pTVar1[-1].tt_ != 0x13) {
            __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x410,"void lua_seti(lua_State *, int, lua_Integer)");
          }
          *(double *)((long)d + ((ulong)t & 0xffffffff) * 8) = (double)(pTStack_58->value_).i;
        }
        else {
          if (pTVar1[-1].tt_ != 0x13) {
            __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x410,"void lua_seti(lua_State *, int, lua_Integer)");
          }
          raviH_set_float(plStack_10,(RaviArray *)val,(ulong)t & 0xffffffff,
                          (double)(pTStack_58->value_).i);
        }
      }
      else {
        lStack_80 = 0.0;
        iVar3 = luaV_tonumber_(pTStack_58,&stack0xffffffffffffff80);
        if (iVar3 == 0) {
          luaG_runerror(plStack_10,"value cannot be converted to number");
        }
        data_2._4_4_ = (uint)t;
        val_1 = (TValue *)val[3].value_.gc;
        if (data_2._4_4_ < *(uint *)&val->field_0xc) {
          ((Value *)&((GCObject *)val_1)->next)[(ulong)t & 0xffffffff].n = lStack_80;
        }
        else {
          raviH_set_float(plStack_10,(RaviArray *)val,(ulong)t & 0xffffffff,lStack_80);
        }
      }
    }
    else {
      pTVar1 = plStack_10->top;
      pTStack_98 = pTVar1 + -1;
      if (pTVar1[-1].tt_ == 0x13) {
        i = (lua_Integer)((RaviArray *)val)->data;
        data_3._4_4_ = uVar2;
        if (uVar2 < ((RaviArray *)val)->len) {
          if (pTVar1[-1].tt_ != 0x13) {
            __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x41b,"void lua_seti(lua_State *, int, lua_Integer)");
          }
          *(Value *)(i + ((ulong)t & 0xffffffff) * 8) = pTStack_98->value_;
        }
        else {
          if (pTVar1[-1].tt_ != 0x13) {
            __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x41b,"void lua_seti(lua_State *, int, lua_Integer)");
          }
          raviH_set_int(plStack_10,(RaviArray *)val,(ulong)t & 0xffffffff,(pTStack_98->value_).i);
        }
      }
      else {
        pGStack_b0 = (GCObject *)0x0;
        iVar3 = luaV_tointeger_(pTStack_98,(lua_Integer *)&stack0xffffffffffffff50);
        if (iVar3 == 0) {
          luaG_runerror(plStack_10,"value cannot be converted to integer");
        }
        if ((uint)t < *(uint *)&val->field_0xc) {
          (&(val[3].value_.gc)->next)[(ulong)t & 0xffffffff] = pGStack_b0;
        }
        else {
          raviH_set_int(plStack_10,(RaviArray *)val,(ulong)t & 0xffffffff,(lua_Integer)pGStack_b0);
        }
      }
    }
    plStack_10->top = plStack_10->top + -1;
  }
LAB_0011b016:
  iVar3 = **(int **)&plStack_10[-1].hookmask + -1;
  **(int **)&plStack_10[-1].hookmask = iVar3;
  if (iVar3 == 0) {
    return;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x425,"void lua_seti(lua_State *, int, lua_Integer)");
}

Assistant:

LUA_API void lua_seti (lua_State *L, int idx, lua_Integer n) {
  StkId t;
  const TValue *slot;
  lua_lock(L);
  api_checknelems(L, 1);
  t = index2addr(L, idx);
  if (ttisLtable(t) || !ttistable(t)) {
    if (luaV_fastgeti(L, t, n, slot)) {
      luaV_finishfastset(L, t, slot, L->top - 1);
      L->top--;  /* pop value */
    }
    else {
      setivalue(L->top, n);
      api_incr_top(L);
      luaV_finishset(L, t, L->top - 1, L->top - 2, slot);
      L->top -= 2;  /* pop value and key */	  
    }
  }
  else {
    RaviArray *h = arrvalue(t);
    if (ttisfarray(t)) {
      TValue *val = L->top - 1;
      if (ttisfloat(val)) { raviH_set_float_inline(L, h, n, fltvalue(val)); }
      else if (ttisinteger(val)) {
        raviH_set_float_inline(L, h, n, (lua_Number)(ivalue(val)));
      }
      else {
        lua_Number d = 0.0;
        if (luaV_tonumber_(val, &d)) { raviH_set_float_inline(L, h, n, d); }
        else
          luaG_runerror(L, "value cannot be converted to number");
      }
    } 
    else {
      TValue *val = L->top - 1;
      if (ttisinteger(val)) { raviH_set_int_inline(L, h, n, ivalue(val)); }
      else {
        lua_Integer i = 0;
        if (luaV_tointeger_(val, &i)) { raviH_set_int_inline(L, h, n, i); }
        else
          luaG_runerror(L, "value cannot be converted to integer");
      }
    }
    L->top--;  /* pop value */
  }
  lua_unlock(L);
}